

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12extend.c
# Opt level: O0

int aom_yv12_realloc_with_new_border_c
              (YV12_BUFFER_CONFIG *ybf,int new_border,int byte_alignment,_Bool alloc_pyramid,
              int num_planes)

{
  undefined4 in_EDX;
  int in_ESI;
  void *in_RDI;
  int error;
  YV12_BUFFER_CONFIG new_buf;
  int in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee4;
  undefined1 local_f8 [3];
  undefined1 in_stack_ffffffffffffff0b;
  int in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  YV12_BUFFER_CONFIG *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff68;
  int local_c;
  
  if (in_RDI == (void *)0x0) {
    local_c = -2;
  }
  else if (in_ESI == *(int *)((long)in_RDI + 0x80)) {
    local_c = 0;
  }
  else {
    memset(local_f8,0,0xd0);
    local_c = aom_alloc_frame_buffer
                        (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                         in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
                         in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                         in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,
                         (_Bool)in_stack_ffffffffffffff0b,in_stack_ffffffffffffff68);
    if (local_c == 0) {
      aom_yv12_copy_frame_c
                (in_stack_ffffffffffffff20,
                 (YV12_BUFFER_CONFIG *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
                 ,in_stack_ffffffffffffff14);
      aom_extend_frame_borders_c
                ((YV12_BUFFER_CONFIG *)CONCAT44(in_stack_fffffffffffffee4,in_EDX),
                 in_stack_fffffffffffffedc);
      aom_free_frame_buffer((YV12_BUFFER_CONFIG *)CONCAT44(in_stack_fffffffffffffedc,in_ESI));
      memcpy(in_RDI,local_f8,0xd0);
      local_c = 0;
    }
  }
  return local_c;
}

Assistant:

int aom_yv12_realloc_with_new_border_c(YV12_BUFFER_CONFIG *ybf, int new_border,
                                       int byte_alignment, bool alloc_pyramid,
                                       int num_planes) {
  if (ybf) {
    if (new_border == ybf->border) return 0;
    YV12_BUFFER_CONFIG new_buf;
    memset(&new_buf, 0, sizeof(new_buf));
    const int error = aom_alloc_frame_buffer(
        &new_buf, ybf->y_crop_width, ybf->y_crop_height, ybf->subsampling_x,
        ybf->subsampling_y, ybf->flags & YV12_FLAG_HIGHBITDEPTH, new_border,
        byte_alignment, alloc_pyramid, 0);
    if (error) return error;
    // Copy image buffer
    aom_yv12_copy_frame(ybf, &new_buf, num_planes);

    // Extend up to new border
    aom_extend_frame_borders(&new_buf, num_planes);

    // Now free the old buffer and replace with the new
    aom_free_frame_buffer(ybf);
    memcpy(ybf, &new_buf, sizeof(new_buf));
    return 0;
  }
  return -2;
}